

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_simple.cpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::CreatePlan(PhysicalPlanGenerator *this,LogicalSimple *op)

{
  LogicalOperatorType LVar1;
  PhysicalOperator *pPVar2;
  NotImplementedException *this_00;
  allocator local_39;
  string local_38;
  
  LVar1 = (op->super_LogicalOperator).type;
  switch(LVar1) {
  case LOGICAL_DROP:
    local_38._M_dataplus._M_p =
         (pointer)(op->info).
                  super_unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
                  super___uniq_ptr_impl<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>
                  .super__Head_base<0UL,_duckdb::ParseInfo_*,_false>._M_head_impl;
    (op->info).super_unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>.
    super__Head_base<0UL,_duckdb::ParseInfo_*,_false>._M_head_impl = (ParseInfo *)0x0;
    pPVar2 = Make<duckdb::PhysicalDrop,duckdb::unique_ptr<duckdb::DropInfo,std::default_delete<duckdb::DropInfo>,true>,unsigned_long&>
                       (this,(unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>
                              *)&local_38,&(op->super_LogicalOperator).estimated_cardinality);
    break;
  case LOGICAL_PRAGMA:
  case LOGICAL_CREATE_TYPE:
switchD_003e1236_caseD_85:
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Unimplemented type for logical simple operator",&local_39);
    NotImplementedException::NotImplementedException(this_00,&local_38);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case LOGICAL_TRANSACTION:
    local_38._M_dataplus._M_p =
         (pointer)(op->info).
                  super_unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
                  super___uniq_ptr_impl<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>
                  .super__Head_base<0UL,_duckdb::ParseInfo_*,_false>._M_head_impl;
    (op->info).super_unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>.
    super__Head_base<0UL,_duckdb::ParseInfo_*,_false>._M_head_impl = (ParseInfo *)0x0;
    pPVar2 = Make<duckdb::PhysicalTransaction,duckdb::unique_ptr<duckdb::TransactionInfo,std::default_delete<duckdb::TransactionInfo>,true>,unsigned_long&>
                       (this,(unique_ptr<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>,_true>
                              *)&local_38,&(op->super_LogicalOperator).estimated_cardinality);
    break;
  case LOGICAL_ATTACH:
    local_38._M_dataplus._M_p =
         (pointer)(op->info).
                  super_unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
                  super___uniq_ptr_impl<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>
                  .super__Head_base<0UL,_duckdb::ParseInfo_*,_false>._M_head_impl;
    (op->info).super_unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>.
    super__Head_base<0UL,_duckdb::ParseInfo_*,_false>._M_head_impl = (ParseInfo *)0x0;
    pPVar2 = Make<duckdb::PhysicalAttach,duckdb::unique_ptr<duckdb::AttachInfo,std::default_delete<duckdb::AttachInfo>,true>,unsigned_long&>
                       (this,(unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>
                              *)&local_38,&(op->super_LogicalOperator).estimated_cardinality);
    break;
  case LOGICAL_DETACH:
    local_38._M_dataplus._M_p =
         (pointer)(op->info).
                  super_unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
                  super___uniq_ptr_impl<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>
                  .super__Head_base<0UL,_duckdb::ParseInfo_*,_false>._M_head_impl;
    (op->info).super_unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>.
    super__Head_base<0UL,_duckdb::ParseInfo_*,_false>._M_head_impl = (ParseInfo *)0x0;
    pPVar2 = Make<duckdb::PhysicalDetach,duckdb::unique_ptr<duckdb::DetachInfo,std::default_delete<duckdb::DetachInfo>,true>,unsigned_long&>
                       (this,(unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true>
                              *)&local_38,&(op->super_LogicalOperator).estimated_cardinality);
    break;
  default:
    if (LVar1 == LOGICAL_UPDATE_EXTENSIONS) {
      local_38._M_dataplus._M_p =
           (pointer)(op->info).
                    super_unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>.
                    _M_t.
                    super___uniq_ptr_impl<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>
                    .super__Head_base<0UL,_duckdb::ParseInfo_*,_false>._M_head_impl;
      (op->info).super_unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
      super___uniq_ptr_impl<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>.
      super__Head_base<0UL,_duckdb::ParseInfo_*,_false>._M_head_impl = (ParseInfo *)0x0;
      pPVar2 = Make<duckdb::PhysicalUpdateExtensions,duckdb::unique_ptr<duckdb::UpdateExtensionsInfo,std::default_delete<duckdb::UpdateExtensionsInfo>,true>,unsigned_long&>
                         (this,(unique_ptr<duckdb::UpdateExtensionsInfo,_std::default_delete<duckdb::UpdateExtensionsInfo>,_true>
                                *)&local_38,&(op->super_LogicalOperator).estimated_cardinality);
    }
    else if (LVar1 == LOGICAL_LOAD) {
      local_38._M_dataplus._M_p =
           (pointer)(op->info).
                    super_unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>.
                    _M_t.
                    super___uniq_ptr_impl<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>
                    .super__Head_base<0UL,_duckdb::ParseInfo_*,_false>._M_head_impl;
      (op->info).super_unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
      super___uniq_ptr_impl<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>.
      super__Head_base<0UL,_duckdb::ParseInfo_*,_false>._M_head_impl = (ParseInfo *)0x0;
      pPVar2 = Make<duckdb::PhysicalLoad,duckdb::unique_ptr<duckdb::LoadInfo,std::default_delete<duckdb::LoadInfo>,true>,unsigned_long&>
                         (this,(unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>
                                *)&local_38,&(op->super_LogicalOperator).estimated_cardinality);
    }
    else {
      if (LVar1 != LOGICAL_ALTER) goto switchD_003e1236_caseD_85;
      local_38._M_dataplus._M_p =
           (pointer)(op->info).
                    super_unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>.
                    _M_t.
                    super___uniq_ptr_impl<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>
                    .super__Head_base<0UL,_duckdb::ParseInfo_*,_false>._M_head_impl;
      (op->info).super_unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
      super___uniq_ptr_impl<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>.
      super__Head_base<0UL,_duckdb::ParseInfo_*,_false>._M_head_impl = (ParseInfo *)0x0;
      pPVar2 = Make<duckdb::PhysicalAlter,duckdb::unique_ptr<duckdb::AlterInfo,std::default_delete<duckdb::AlterInfo>,true>,unsigned_long&>
                         (this,(unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>
                                *)&local_38,&(op->super_LogicalOperator).estimated_cardinality);
    }
  }
  if ((ParseInfo *)local_38._M_dataplus._M_p != (ParseInfo *)0x0) {
    (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
  }
  return pPVar2;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::CreatePlan(LogicalSimple &op) {
	switch (op.type) {
	case LogicalOperatorType::LOGICAL_ALTER:
		return Make<PhysicalAlter>(unique_ptr_cast<ParseInfo, AlterInfo>(std::move(op.info)), op.estimated_cardinality);
	case LogicalOperatorType::LOGICAL_DROP:
		return Make<PhysicalDrop>(unique_ptr_cast<ParseInfo, DropInfo>(std::move(op.info)), op.estimated_cardinality);
	case LogicalOperatorType::LOGICAL_TRANSACTION:
		return Make<PhysicalTransaction>(unique_ptr_cast<ParseInfo, TransactionInfo>(std::move(op.info)),
		                                 op.estimated_cardinality);
	case LogicalOperatorType::LOGICAL_LOAD:
		return Make<PhysicalLoad>(unique_ptr_cast<ParseInfo, LoadInfo>(std::move(op.info)), op.estimated_cardinality);
	case LogicalOperatorType::LOGICAL_ATTACH:
		return Make<PhysicalAttach>(unique_ptr_cast<ParseInfo, AttachInfo>(std::move(op.info)),
		                            op.estimated_cardinality);
	case LogicalOperatorType::LOGICAL_DETACH:
		return Make<PhysicalDetach>(unique_ptr_cast<ParseInfo, DetachInfo>(std::move(op.info)),
		                            op.estimated_cardinality);
	case LogicalOperatorType::LOGICAL_UPDATE_EXTENSIONS:
		return Make<PhysicalUpdateExtensions>(unique_ptr_cast<ParseInfo, UpdateExtensionsInfo>(std::move(op.info)),
		                                      op.estimated_cardinality);
	default:
		throw NotImplementedException("Unimplemented type for logical simple operator");
	}
}